

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Easy.cpp
# Opt level: O0

void __thiscall curlpp::Easy::reset(Easy *this)

{
  long in_RDI;
  CurlHandle *in_stack_ffffffffffffffa0;
  OptionList *in_stack_ffffffffffffffb8;
  OptionList *in_stack_ffffffffffffffc0;
  
  std::auto_ptr<curlpp::internal::CurlHandle>::operator->
            ((auto_ptr<curlpp::internal::CurlHandle> *)(in_RDI + 8));
  internal::CurlHandle::reset(in_stack_ffffffffffffffa0);
  internal::OptionList::OptionList((OptionList *)0x146d6f);
  internal::OptionList::setOpt(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  internal::OptionList::~OptionList(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void
curlpp::Easy::reset ()
{
	mCurl->reset();
	mOptions.setOpt(internal::OptionList());
}